

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# supdup.c
# Opt level: O0

void supdup_log(Plug *plug,PlugLogType type,SockAddr *addr,int port,char *error_msg,int error_code)

{
  Supdup *supdup;
  int error_code_local;
  char *error_msg_local;
  int port_local;
  SockAddr *addr_local;
  PlugLogType type_local;
  Plug *plug_local;
  
  backend_socket_log((Seat *)plug[-0x10].vt,(LogContext *)plug[-0xf].vt,type,addr,port,error_msg,
                     error_code,(Conf *)plug[-7].vt,(_Bool)(*(byte *)&plug[-0x11].vt & 1));
  if ((type == PLUGLOG_CONNECT_SUCCESS) &&
     (*(undefined1 *)&plug[-0x11].vt = 1, plug[-0xe].vt != (PlugVtable *)0x0)) {
    ldisc_check_sendok((Ldisc *)plug[-0xe].vt);
  }
  return;
}

Assistant:

static void supdup_log(Plug *plug, PlugLogType type, SockAddr *addr, int port,
                       const char *error_msg, int error_code)
{
    Supdup *supdup = container_of(plug, Supdup, plug);
    backend_socket_log(supdup->seat, supdup->logctx, type, addr, port,
                       error_msg, error_code,
                       supdup->conf, supdup->socket_connected);
    if (type == PLUGLOG_CONNECT_SUCCESS) {
        supdup->socket_connected = true;
        if (supdup->ldisc)
            ldisc_check_sendok(supdup->ldisc);
    }
}